

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fits_parser_set_temporary_col
              (ParseData *lParse,parseInfo *Info,long nrows,void *nulval,int *status)

{
  int iVar1;
  ParseData *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int col_cnt;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 local_4;
  
  if (*in_R8 == 0) {
    iVar2 = *(int *)(in_RDI + 0x60);
    iVar1 = fits_parser_allocateCol
                      (in_RCX,(int)((ulong)in_R8 >> 0x20),
                       (int *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    if (iVar1 == 0) {
      fits_iter_set_by_num
                ((iteratorCol *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 0x110),(fitsfile *)0x0,0,
                 0x52,3);
      *(undefined8 *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 0x110 + 0x68) =
           *(undefined8 *)(in_RDI + 0x68);
      *(undefined8 *)(in_RSI + 8) = 0;
      *(ParseData **)(in_RSI + 0x10) = in_RCX;
      *(undefined8 *)(in_RSI + 0x18) = in_RDX;
      *(long *)(in_RSI + 0x28) = in_RDI;
      *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + 1;
      local_4 = 0;
    }
    else {
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int fits_parser_set_temporary_col(ParseData *lParse,
				  parseInfo *Info,
				  long int nrows,
				  void *nulval,
				  int *status)
{
  int col_cnt;
  /* Setup iterator column and parser information to be ready to compute 
     temporary calculator expression */

  if (*status) return *status;

  col_cnt = lParse->nCols;

  if( fits_parser_allocateCol( lParse, col_cnt, status ) ) return *status;
	
  /* Set important variables for TemporaryCol where calculated results end up */
  fits_iter_set_by_num( &(lParse->colData[col_cnt]), 0, 0, TDOUBLE, TemporaryCol);
  lParse->colData[col_cnt].repeat = lParse->nElements;
  Info->dataPtr = NULL;
  Info->nullPtr = nulval;
  Info->maxRows = nrows;
  Info->parseData = lParse;
  lParse->nCols ++;

  return 0;
}